

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

int __thiscall ON_Xform::SignOfDeterminant(ON_Xform *this,bool bFastTest)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  undefined7 in_register_00000031;
  double dVar9;
  double p;
  double d;
  double I [4] [4];
  double local_a8;
  double local_a0;
  double local_98 [16];
  
  if (((int)CONCAT71(in_register_00000031,bFastTest) != 0) &&
     (((((dVar1 = this->m_xform[3][0], dVar1 == 0.0 && (!NAN(dVar1))) &&
        (dVar1 = this->m_xform[3][1], dVar1 == 0.0)) &&
       (((!NAN(dVar1) && (dVar1 = this->m_xform[3][2], dVar1 == 0.0)) && (!NAN(dVar1))))) ||
      (((dVar1 = this->m_xform[0][3], dVar1 == 0.0 && (!NAN(dVar1))) &&
       ((dVar1 = this->m_xform[1][3], dVar1 == 0.0 &&
        (((!NAN(dVar1) && (dVar1 = this->m_xform[2][3], dVar1 == 0.0)) && (!NAN(dVar1))))))))))) {
    dVar1 = this->m_xform[3][3];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar9 = this->m_xform[1][0];
      dVar2 = this->m_xform[1][1];
      dVar3 = this->m_xform[2][2];
      dVar4 = this->m_xform[1][2];
      dVar5 = this->m_xform[2][1];
      dVar6 = this->m_xform[2][0];
      dVar9 = (dVar9 * dVar5 - dVar6 * dVar2) * this->m_xform[0][2] +
              (dVar2 * dVar3 - dVar5 * dVar4) * this->m_xform[0][0] +
              (dVar4 * dVar6 - dVar3 * dVar9) * this->m_xform[0][1];
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        if (1e-08 < ABS(dVar9)) {
          bVar7 = 0.0 <= dVar1;
          iVar8 = (bVar7 - 1) + (uint)bVar7;
          if (dVar9 < 0.0) {
            iVar8 = (uint)bVar7 * -2 + 1;
          }
          return iVar8;
        }
        goto LAB_0067bf86;
      }
    }
    return 0;
  }
LAB_0067bf86:
  local_a0 = 0.0;
  local_a8 = 0.0;
  Inv((double *)this,(double (*) [4])local_98,&local_a0,&local_a8);
  dVar1 = (double)(~-(ulong)(local_a0 != 0.0) & (ulong)local_a0 |
                  (ulong)(1.0 / local_a0) & -(ulong)(local_a0 != 0.0));
  iVar8 = (uint)(0.0 <= dVar1) * 2 + -1;
  if (ABS(dVar1) <= 2.3283064365386963e-10) {
    iVar8 = 0;
  }
  if (ABS(local_a8) <= 2.3283064365386963e-10) {
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int ON_Xform::SignOfDeterminant(bool bFastTest) const
{
  if (bFastTest)
  {
    if (
      (0.0 == m_xform[3][0] && 0.0 == m_xform[3][1] && 0.0 == m_xform[3][2])
      ||
      (0.0 == m_xform[0][3] && 0.0 == m_xform[1][3] && 0.0 == m_xform[2][3])
      )
    {
      // vast majority of the 4x4 cases in practice.

      if (0.0 == m_xform[3][3])
      {
        return 0; // 100% accurate result.
      }

      // Use the simple 3x3 formula with the fewest flops.
      const double x
        = m_xform[0][0] * (m_xform[1][1] * m_xform[2][2] - m_xform[1][2] * m_xform[2][1])
        + m_xform[0][1] * (m_xform[1][2] * m_xform[2][0] - m_xform[1][0] * m_xform[2][2])
        + m_xform[0][2] * (m_xform[1][0] * m_xform[2][1] - m_xform[1][1] * m_xform[2][0]);

      if (0.0 == x)
      {
        // It is very likely we had a simple case and, mathematically, det = 0.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        return 0;
      }

      if (fabs(x) > 1e-8)
      {
        // x is big enough that it's very likely the sign is mathematically correct.
        // (not a 100% safe assumption, but good enough for bFastTest = true case).
        const int s = ((x < 0.0) ? -1 : 1) * ((m_xform[3][3] < 0.0) ? -1 : 1);
        return s;
      }
    }
  }

  // do it a very slow and careful way
  double min_pivot = 0.0;
  const double det = this->Determinant(&min_pivot);
  if (fabs(min_pivot) > ON_ZERO_TOLERANCE && fabs(det) > ON_ZERO_TOLERANCE)
  {
    return (det < 0.0) ? -1 : 1;
  }

  return 0;
}